

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O0

WCHAR * DumpCallStackFull(uint frameCount,bool print)

{
  bool bVar1;
  BOOL BVar2;
  ThreadContext *this;
  ArenaAllocator *alloc;
  void *pvVar3;
  JavascriptFunction *this_00;
  undefined8 uVar4;
  char16 *pcVar5;
  Var *ppvVar6;
  uint uVar7;
  WCHAR *stack;
  LONG local_5a0;
  uint i;
  LONG column;
  ULONG line;
  WCHAR *sourceFileName;
  CallInfo callInfo;
  FunctionBody *jsBody;
  JavascriptFunction *jsFunc;
  char16 debugStringBuffer [42];
  void *codeAddr;
  uint fc;
  undefined1 local_500 [8];
  StringBuilder<Memory::ArenaAllocator> sb;
  WCHAR buffer [512];
  undefined1 local_c0 [8];
  JavascriptStackWalker walker;
  ScriptContext *scriptContext;
  bool print_local;
  uint frameCount_local;
  
  this = ThreadContext::GetContextForCurrentThread();
  walker.currentFrame.stackCheckCodeHeight = (size_t)ThreadContext::GetScriptContextList(this);
  Js::JavascriptStackWalker::JavascriptStackWalker
            ((JavascriptStackWalker *)local_c0,
             (ScriptContext *)walker.currentFrame.stackCheckCodeHeight,true,(PVOID)0x0,false);
  alloc = Js::ScriptContext::GeneralAllocator
                    ((ScriptContext *)walker.currentFrame.stackCheckCodeHeight);
  Js::StringBuilder<Memory::ArenaAllocator>::StringBuilder
            ((StringBuilder<Memory::ArenaAllocator> *)local_500,alloc);
  codeAddr._0_4_ = 0;
  do {
    do {
      BVar2 = Js::JavascriptStackWalker::Walk((JavascriptStackWalker *)local_c0,true);
      if (BVar2 == 0) goto LAB_00a0ea90;
      pvVar3 = Js::JavascriptStackWalker::GetCurrentCodeAddr((JavascriptStackWalker *)local_c0);
      bVar1 = Js::JavascriptStackWalker::IsJavascriptFrame((JavascriptStackWalker *)local_c0);
    } while (!bVar1);
    StringCchPrintfW((WCHAR *)&sb.firstChunkLength,0x200,L"0x%p  ",pvVar3);
    Js::StringBuilder<Memory::ArenaAllocator>::AppendSz
              ((StringBuilder<Memory::ArenaAllocator> *)local_500,(char16 *)&sb.firstChunkLength);
    this_00 = Js::JavascriptStackWalker::GetCurrentFunction((JavascriptStackWalker *)local_c0,true);
    callInfo = (CallInfo)Js::JavascriptFunction::GetFunctionBody(this_00);
    sourceFileName =
         (WCHAR *)Js::JavascriptStackWalker::GetCallInfo((JavascriptStackWalker *)local_c0,true);
    _column = L"NULL";
    i = 0;
    local_5a0 = 0;
    Js::JavascriptStackWalker::GetSourcePosition
              ((JavascriptStackWalker *)local_c0,(WCHAR **)&column,&i,&local_5a0);
    uVar4 = (**(code **)(*(long *)callInfo + 0x38))();
    pcVar5 = Js::FunctionProxy::GetDebugNumberSet((FunctionProxy *)callInfo,(wchar (*) [42])&jsFunc)
    ;
    uVar7 = (uint)sourceFileName & 0xffffff;
    StringCchPrintfW((WCHAR *)&sb.firstChunkLength,0x200,L"%s [%s] (0x%p, Args=%u",uVar4,pcVar5,
                     this_00,uVar7);
    Js::StringBuilder<Memory::ArenaAllocator>::AppendSz
              ((StringBuilder<Memory::ArenaAllocator> *)local_500,(char16 *)&sb.firstChunkLength);
    for (stack._4_4_ = 0; stack._4_4_ < ((uint)sourceFileName & 0xffffff);
        stack._4_4_ = stack._4_4_ + 1) {
      ppvVar6 = Js::JavascriptStackWalker::GetJavascriptArgs
                          ((JavascriptStackWalker *)local_c0,false);
      StringCchPrintfW((WCHAR *)&sb.firstChunkLength,0x200,L", 0x%p",ppvVar6[stack._4_4_]);
      Js::StringBuilder<Memory::ArenaAllocator>::AppendSz
                ((StringBuilder<Memory::ArenaAllocator> *)local_500,(char16 *)&sb.firstChunkLength);
    }
    StringCchPrintfW((WCHAR *)&sb.firstChunkLength,0x200,L")[%s (%u, %d)]\n",_column,(ulong)(i + 1),
                     (ulong)(local_5a0 + 1),uVar7);
    Js::StringBuilder<Memory::ArenaAllocator>::AppendSz
              ((StringBuilder<Memory::ArenaAllocator> *)local_500,(char16 *)&sb.firstChunkLength);
    codeAddr._0_4_ = (uint)codeAddr + 1;
  } while ((uint)codeAddr < frameCount);
LAB_00a0ea90:
  Js::StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<72ul>
            ((StringBuilder<Memory::ArenaAllocator> *)local_500,(char16 (*) [72])0x17c32d8);
  pcVar5 = Js::StringBuilder<Memory::ArenaAllocator>::Detach
                     ((StringBuilder<Memory::ArenaAllocator> *)local_500);
  if (print) {
    Output::Print(pcVar5);
  }
  Js::JavascriptStackWalker::~JavascriptStackWalker((JavascriptStackWalker *)local_c0);
  return pcVar5;
}

Assistant:

WCHAR* DumpCallStackFull(uint frameCount, bool print)
{
    Js::ScriptContext* scriptContext = ThreadContext::GetContextForCurrentThread()->GetScriptContextList();
    Js::JavascriptStackWalker walker(scriptContext);

    WCHAR buffer[512];
    Js::StringBuilder<ArenaAllocator> sb(scriptContext->GeneralAllocator());
    uint fc = 0;
    while (walker.Walk())
    {
        void * codeAddr = walker.GetCurrentCodeAddr();
        if (walker.IsJavascriptFrame())
        {
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            StringCchPrintf(buffer, _countof(buffer), _u("0x%p  "), codeAddr);
            sb.AppendSz(buffer);
            // Found a JavascriptFunction.  Dump its name and parameters.
            Js::JavascriptFunction *jsFunc = walker.GetCurrentFunction();

            Js::FunctionBody * jsBody = jsFunc->GetFunctionBody();
            const Js::CallInfo callInfo = walker.GetCallInfo();
            const WCHAR* sourceFileName = _u("NULL");
            ULONG line = 0; LONG column = 0;
            walker.GetSourcePosition(&sourceFileName, &line, &column);

            StringCchPrintf(buffer, _countof(buffer), _u("%s [%s] (0x%p, Args=%u"), jsBody->GetDisplayName(), jsBody->GetDebugNumberSet(debugStringBuffer), jsFunc,
                callInfo.Count);
            sb.AppendSz(buffer);

            for (uint i = 0; i < callInfo.Count; i++)
            {
                StringCchPrintf(buffer, _countof(buffer), _u(", 0x%p"), walker.GetJavascriptArgs(false /*boxArgs*/)[i]);
                sb.AppendSz(buffer);
            }
            StringCchPrintf(buffer, _countof(buffer), _u(")[%s (%u, %d)]\n"), sourceFileName, line + 1, column + 1);
            sb.AppendSz(buffer);
            fc++;
            if(fc >= frameCount)
            {
                break;
            }
       }
    }
    sb.AppendCppLiteral(_u("----------------------------------------------------------------------\n"));
    WCHAR* stack = sb.Detach();
    if(print)
    {
        Output::Print(stack);
    }
    return stack;
}